

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void relativePointerHandleRelativeMotion
               (void *userData,zwp_relative_pointer_v1 *pointer,uint32_t timeHi,uint32_t timeLo,
               wl_fixed_t dx,wl_fixed_t dy,wl_fixed_t dxUnaccel,wl_fixed_t dyUnaccel)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 local_40;
  double ypos;
  double xpos;
  _GLFWwindow *window;
  wl_fixed_t dy_local;
  wl_fixed_t dx_local;
  uint32_t timeLo_local;
  uint32_t timeHi_local;
  zwp_relative_pointer_v1 *pointer_local;
  void *userData_local;
  
  dVar1 = *(double *)((long)userData + 0x1f8);
  dVar2 = *(double *)((long)userData + 0x200);
  if (*(int *)((long)userData + 0x8c) == 0x34003) {
    if (*(int *)((long)userData + 0x208) == 0) {
      dVar3 = wl_fixed_to_double(dx);
      local_40 = wl_fixed_to_double(dy);
    }
    else {
      dVar3 = wl_fixed_to_double(dxUnaccel);
      local_40 = wl_fixed_to_double(dyUnaccel);
    }
    ypos = dVar3 + dVar1;
    local_40 = local_40 + dVar2;
    _glfwInputCursorPos((_GLFWwindow *)userData,ypos,local_40);
  }
  return;
}

Assistant:

static void relativePointerHandleRelativeMotion(void* userData,
                                                struct zwp_relative_pointer_v1* pointer,
                                                uint32_t timeHi,
                                                uint32_t timeLo,
                                                wl_fixed_t dx,
                                                wl_fixed_t dy,
                                                wl_fixed_t dxUnaccel,
                                                wl_fixed_t dyUnaccel)
{
    _GLFWwindow* window = userData;
    double xpos = window->virtualCursorPosX;
    double ypos = window->virtualCursorPosY;

    if (window->cursorMode != GLFW_CURSOR_DISABLED)
        return;

    if (window->rawMouseMotion)
    {
        xpos += wl_fixed_to_double(dxUnaccel);
        ypos += wl_fixed_to_double(dyUnaccel);
    }
    else
    {
        xpos += wl_fixed_to_double(dx);
        ypos += wl_fixed_to_double(dy);
    }

    _glfwInputCursorPos(window, xpos, ypos);
}